

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  char **ppcVar8;
  uint uVar9;
  char *pcVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  long lVar11;
  int iVar12;
  byte *pbVar13;
  long lStack_50;
  
  if (end <= ptr) {
    return -4;
  }
  iVar4 = 0;
  uVar6 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uVar9 = uVar6 - 2;
  if (0x22 < uVar9) goto switchD_0034910a_caseD_3;
  iVar12 = 0x12;
  lVar11 = 1;
  puVar7 = &switchD_0034910a::switchdataD_0048fc50;
  pcVar10 = (char *)((long)&switchD_0034910a::switchdataD_0048fc50 +
                    (long)(int)(&switchD_0034910a::switchdataD_0048fc50)[uVar9]);
  switch(uVar6) {
  case 2:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -1;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    switch(bVar2) {
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      pbVar13 = (byte *)(ptr + 2);
      if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
        return -1;
      }
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar13)) {
      case 0x14:
        *nextTokPtr = ptr + 3;
        return 0x21;
      case 0x16:
      case 0x18:
        pbVar13 = (byte *)(ptr + 3);
        pcVar10 = end + (-4 - (long)ptr);
LAB_0034966a:
        if (pcVar10 == (char *)0xffffffffffffffff || (long)(pcVar10 + 1) < 0) {
          return -1;
        }
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
        switch(bVar2) {
        case 0x15:
          break;
        case 0x16:
        case 0x18:
          goto switchD_00349697_caseD_16;
        case 0x17:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x1d:
          goto switchD_00349697_caseD_17;
        case 0x1e:
          if (pcVar10 == (char *)0x0) {
            return -1;
          }
          uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)pbVar13[1]);
          if ((uVar9 < 0x1f) && ((0x40200600U >> (uVar9 & 0x1f) & 1) != 0))
          goto switchD_00349697_caseD_17;
          break;
        default:
          if (1 < bVar2 - 9) goto switchD_00349697_caseD_17;
        }
        *nextTokPtr = (char *)pbVar13;
        return 0x10;
      case 0x1b:
        iVar4 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar4;
      }
      break;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      break;
    case 0x16:
    case 0x18:
switchD_0034943e_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar2 - 5 < 3) || (bVar2 == 0x1d)) goto switchD_0034943e_caseD_16;
    }
    *nextTokPtr = (char *)pbVar13;
    goto LAB_0034959a;
  default:
    goto switchD_0034910a_caseD_3;
  case 4:
    pcVar10 = ptr + 1;
    if ((long)end - (long)pcVar10 < 1) {
      return -0x1a;
    }
    if (*pcVar10 == ']') {
      if ((long)end - (long)pcVar10 == 1) {
        return -1;
      }
      if (ptr[2] == '>') {
        *nextTokPtr = ptr + 3;
        return 0x22;
      }
    }
    *nextTokPtr = pcVar10;
    iVar4 = 0x1a;
    break;
  case 5:
    if ((long)end - (long)ptr < 2) goto LAB_00349314;
    iVar4 = (*enc[3].literalScanners[0])
                      (enc,ptr,pcVar10,(char **)&switchD_0034910a::switchdataD_0048fc50);
    lVar11 = 2;
    if (iVar4 != 0) {
LAB_00349406:
      iVar12 = 0x12;
      bVar3 = false;
      goto LAB_0034948b;
    }
    iVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX,(char **)puVar7);
LAB_00349472:
    pbVar13 = (byte *)ptr;
    if (iVar4 != 0) {
      iVar12 = 0x13;
      bVar3 = true;
      goto LAB_0034948b;
    }
switchD_00349697_caseD_17:
    *nextTokPtr = (char *)pbVar13;
    goto LAB_0034959a;
  case 6:
    if (2 < (long)end - (long)ptr) {
      iVar4 = (*enc[3].literalScanners[1])
                        (enc,ptr,pcVar10,(char **)&switchD_0034910a::switchdataD_0048fc50);
      lVar11 = 3;
      if (iVar4 != 0) goto LAB_00349406;
      iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_01,(char **)puVar7);
      goto LAB_00349472;
    }
    goto LAB_00349314;
  case 7:
    if (3 < (long)end - (long)ptr) {
      iVar4 = (*enc[3].nameMatchesAscii)
                        (enc,ptr,pcVar10,(char *)&switchD_0034910a::switchdataD_0048fc50);
      lVar11 = 4;
      if (iVar4 != 0) goto LAB_00349406;
      iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_00,(char **)puVar7);
      goto LAB_00349472;
    }
LAB_00349314:
    iVar4 = -2;
    break;
  case 9:
    if (ptr + 1 == end) {
      *nextTokPtr = end;
      return -0xf;
    }
  case 10:
  case 0x15:
    pcVar10 = end + ~(ulong)ptr;
    for (pbVar13 = (byte *)(ptr + 1);
        (0 < (long)pcVar10 &&
        (((cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar13), cVar1 == '\x15' ||
          (cVar1 == '\n')) || ((cVar1 == '\t' && (pbVar13 + 1 != (byte *)end))))));
        pbVar13 = pbVar13 + 1) {
      pcVar10 = pcVar10 + -1;
    }
    *nextTokPtr = (char *)pbVar13;
    iVar4 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x11;
    break;
  case 0xc:
    lStack_50._0_4_ = 0xc;
    goto LAB_0034935e;
  case 0xd:
    lStack_50._0_4_ = 0xd;
LAB_0034935e:
    iVar4 = normal_scanLit((int)lStack_50,enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 0x13:
    ptr = ptr + 1;
    uVar5 = (long)end - (long)ptr;
    if ((long)uVar5 < 1) {
      return -1;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    ppcVar8 = (char **)(ulong)bVar2;
    lVar11 = 1;
    lStack_50 = lVar11;
    if (bVar2 == 0x18) {
LAB_003496ec:
      for (ptr = (char *)((byte *)ptr + lStack_50); uVar5 = (long)end - (long)ptr, 0 < (long)uVar5;
          ptr = (char *)((byte *)ptr + lStack_50)) {
        uVar6 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        uVar9 = uVar6 - 5;
        if (0x1f < uVar9) {
switchD_00349729_caseD_8:
          goto LAB_003497a0;
        }
        pcVar10 = (char *)((long)&switchD_00349729::switchdataD_0048fd5c +
                          (long)(int)(&switchD_00349729::switchdataD_0048fd5c)[uVar9]);
        lStack_50 = lVar11;
        switch(uVar6) {
        case 5:
          if (uVar5 == 1) goto LAB_003495f7;
          iVar4 = (*enc[3].scanners[0])(enc,ptr,pcVar10,(char **)0x1);
          lStack_50 = 2;
          break;
        case 6:
          if (uVar5 < 3) goto LAB_003495f7;
          iVar4 = (*enc[3].scanners[1])(enc,ptr,pcVar10,(char **)0x1);
          lStack_50 = 3;
          break;
        case 7:
          if (uVar5 < 4) goto LAB_003495f7;
          iVar4 = (*enc[3].scanners[2])(enc,ptr,pcVar10,(char **)0x1);
          lStack_50 = 4;
          break;
        default:
          goto switchD_00349729_caseD_8;
        case 9:
        case 10:
        case 0xb:
        case 0x15:
        case 0x1e:
        case 0x20:
        case 0x24:
          iVar4 = 0x14;
          goto switchD_0034910a_caseD_3;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_00349729_caseD_16;
        }
        if (iVar4 == 0) goto switchD_00349729_caseD_8;
switchD_00349729_caseD_16:
      }
      iVar4 = -0x14;
    }
    else {
      if (bVar2 == 6) {
        if (2 < uVar5) {
          iVar4 = (*enc[3].literalScanners[1])(enc,ptr,(char *)0x1,ppcVar8);
          lStack_50 = 3;
LAB_003496e3:
          if (iVar4 == 0) {
LAB_003497a0:
            iVar4 = 0;
switchD_0034910a_caseD_3:
            *nextTokPtr = ptr;
            return iVar4;
          }
          goto LAB_003496ec;
        }
      }
      else {
        if (bVar2 != 7) {
          if (bVar2 != 0x16) {
            if (bVar2 == 5) {
              if (uVar5 != 1) {
                iVar4 = (*enc[3].literalScanners[0])(enc,ptr,(char *)0x1,ppcVar8);
                lStack_50 = 2;
                goto LAB_003496e3;
              }
              goto LAB_003495f7;
            }
            goto LAB_003497a0;
          }
          goto LAB_003496ec;
        }
        if (3 < uVar5) {
          iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,(char *)0x1,(char *)ppcVar8);
          lStack_50 = 4;
          goto LAB_003496e3;
        }
      }
LAB_003495f7:
      iVar4 = -2;
    }
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x19;
    break;
  case 0x16:
  case 0x18:
    bVar3 = false;
    goto LAB_0034948b;
  case 0x19:
  case 0x1a:
  case 0x1b:
    iVar12 = 0x13;
    bVar3 = true;
LAB_0034948b:
    pbVar13 = (byte *)(ptr + lVar11);
LAB_00349498:
    uVar5 = (long)end - (long)pbVar13;
    if ((long)uVar5 < 1) {
      return -iVar12;
    }
    uVar6 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    uVar9 = uVar6 - 5;
    if (0x1f < uVar9) goto switchD_003494ca_caseD_8;
    pcVar10 = (char *)((long)&switchD_003494ca::switchdataD_0048fcdc +
                      (long)(int)(&switchD_003494ca::switchdataD_0048fcdc)[uVar9]);
    lStack_50 = 1;
    switch(uVar6) {
    case 5:
      if (uVar5 != 1) {
        iVar4 = (*enc[3].scanners[0])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
        lStack_50 = 2;
        goto LAB_00349539;
      }
      goto LAB_00349314;
    case 6:
      if (2 < uVar5) {
        iVar4 = (*enc[3].scanners[1])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
        lStack_50 = 3;
        goto LAB_00349539;
      }
      goto LAB_00349314;
    case 7:
      if (uVar5 < 4) goto LAB_00349314;
      iVar4 = (*enc[3].scanners[2])(enc,(char *)pbVar13,pcVar10,(char **)0x1);
      lStack_50 = 4;
LAB_00349539:
      if (iVar4 == 0) break;
switchD_003494ca_caseD_16:
      pbVar13 = pbVar13 + lStack_50;
      goto LAB_00349498;
    case 9:
    case 10:
    case 0xb:
    case 0x14:
    case 0x15:
    case 0x1e:
    case 0x20:
    case 0x23:
    case 0x24:
      *nextTokPtr = (char *)pbVar13;
      return iVar12;
    case 0xf:
      if (!bVar3) {
        *nextTokPtr = (char *)(pbVar13 + 1);
        return 0x1e;
      }
      break;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_003494ca_caseD_16;
    case 0x21:
      if (!bVar3) {
        *nextTokPtr = (char *)(pbVar13 + 1);
        return 0x1f;
      }
      break;
    case 0x22:
      if (!bVar3) {
        *nextTokPtr = (char *)(pbVar13 + 1);
        return 0x20;
      }
    }
switchD_003494ca_caseD_8:
    *nextTokPtr = (char *)pbVar13;
    goto LAB_0034959a;
  case 0x1e:
    iVar4 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x17;
    break;
  case 0x20:
    pbVar13 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar13 || (long)end - (long)pbVar13 < 0) {
      return -0x18;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar13);
    switch(bVar2) {
    case 0x20:
    case 0x23:
    case 0x24:
switchD_00349458_caseD_20:
      *nextTokPtr = (char *)pbVar13;
      return 0x18;
    case 0x21:
      *nextTokPtr = ptr + 2;
      return 0x24;
    case 0x22:
      *nextTokPtr = ptr + 2;
      return 0x25;
    default:
      if (bVar2 - 9 < 3) goto switchD_00349458_caseD_20;
    }
    if (bVar2 == 0xf) {
      *nextTokPtr = ptr + 2;
      return 0x23;
    }
    if (bVar2 == 0x15) goto switchD_00349458_caseD_20;
    *nextTokPtr = (char *)pbVar13;
LAB_0034959a:
    iVar4 = 0;
    break;
  case 0x23:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x15;
  }
  return iVar4;
switchD_00349697_caseD_16:
  pbVar13 = pbVar13 + 1;
  pcVar10 = pcVar10 + -1;
  goto LAB_0034966a;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr)
{
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      REQUIRE_CHAR(enc, ptr, end);
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}